

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O2

int VP8GetHeaders(VP8Decoder *dec,VP8Io *io)

{
  VP8BitReader *br_00;
  byte bVar1;
  uint3 *puVar2;
  ulong uVar3;
  VP8StatusCode VVar4;
  uint3 uVar5;
  int8_t iVar6;
  uint8_t uVar7;
  uint uVar8;
  int iVar9;
  uint32_t uVar10;
  int iVar12;
  char *pcVar13;
  byte bVar14;
  int iVar15;
  size_t size;
  byte bVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  int s;
  ulong uVar20;
  long lVar21;
  ulong size_00;
  byte *data;
  VP8BitReader *br_01;
  ulong data_size;
  byte *start;
  VP8BitReader *br;
  int32_t iVar11;
  
  if (dec == (VP8Decoder *)0x0) {
    return 0;
  }
  dec->status_ = VP8_STATUS_OK;
  dec->error_msg_ = "OK";
  if (io == (VP8Io *)0x0) {
    dec->status_ = VP8_STATUS_INVALID_PARAM;
    pcVar13 = "null VP8Io passed to VP8GetHeaders()";
  }
  else {
    uVar20 = io->data_size;
    if (uVar20 < 4) {
      dec->status_ = VP8_STATUS_NOT_ENOUGH_DATA;
      pcVar13 = "Truncated header.";
    }
    else {
      puVar2 = (uint3 *)io->data;
      bVar1 = (byte)*puVar2;
      uVar5 = *puVar2;
      (dec->frm_hdr_).key_frame_ = bVar1 & 1 ^ 1;
      bVar16 = bVar1 >> 1 & 7;
      (dec->frm_hdr_).profile_ = bVar16;
      bVar14 = bVar1 >> 4 & 1;
      (dec->frm_hdr_).show_ = bVar14;
      uVar8 = (uint)(uVar5 >> 5);
      (dec->frm_hdr_).partition_length_ = uVar8;
      if (bVar16 < 4) {
        if (bVar14 == 0) {
          dec->status_ = VP8_STATUS_UNSUPPORTED_FEATURE;
          pcVar13 = "Frame not displayable.";
        }
        else {
          data = (byte *)((long)puVar2 + 3);
          data_size = uVar20 - 3;
          if ((bVar1 & 1) == 0) {
            if (data_size < 7) {
              dec->status_ = VP8_STATUS_NOT_ENOUGH_DATA;
              pcVar13 = "cannot parse picture header";
            }
            else {
              iVar9 = VP8CheckSignature(data,data_size);
              if (iVar9 != 0) {
                bVar1 = *(byte *)((long)puVar2 + 6);
                iVar15 = (*(byte *)((long)puVar2 + 7) & 0x3f) * 0x100;
                iVar9 = iVar15 + (uint)bVar1;
                (dec->pic_hdr_).width_ = (uint16_t)iVar9;
                (dec->pic_hdr_).xscale_ = *(byte *)((long)puVar2 + 7) >> 6;
                uVar5 = puVar2[2];
                iVar19 = (*(byte *)((long)puVar2 + 9) & 0x3f) * 0x100;
                iVar12 = iVar19 + (uint)(byte)uVar5;
                (dec->pic_hdr_).height_ = (uint16_t)iVar12;
                (dec->pic_hdr_).yscale_ = *(byte *)((long)puVar2 + 9) >> 6;
                dec->mb_w_ = iVar15 + (uint)bVar1 + 0xf >> 4;
                dec->mb_h_ = iVar19 + (uint)(byte)uVar5 + 0xf >> 4;
                io->width = iVar9;
                io->height = iVar12;
                io->use_cropping = 0;
                io->crop_left = 0;
                io->crop_top = 0;
                data = (byte *)((long)puVar2 + 10);
                data_size = uVar20 - 10;
                io->crop_right = iVar9;
                io->crop_bottom = iVar12;
                io->use_scaling = 0;
                io->scaled_width = iVar9;
                io->scaled_height = iVar12;
                io->mb_w = iVar9;
                io->mb_h = iVar12;
                VP8ResetProba(&dec->proba_);
                (dec->segment_hdr_).use_segment_ = 0;
                (dec->segment_hdr_).update_map_ = 0;
                (dec->segment_hdr_).absolute_delta_ = 1;
                (dec->segment_hdr_).quantizer_[0] = '\0';
                (dec->segment_hdr_).quantizer_[1] = '\0';
                (dec->segment_hdr_).quantizer_[2] = '\0';
                (dec->segment_hdr_).quantizer_[3] = '\0';
                (dec->segment_hdr_).filter_strength_[0] = '\0';
                (dec->segment_hdr_).filter_strength_[1] = '\0';
                (dec->segment_hdr_).filter_strength_[2] = '\0';
                (dec->segment_hdr_).filter_strength_[3] = '\0';
                uVar8 = (dec->frm_hdr_).partition_length_;
                goto LAB_0010c5b2;
              }
              dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
              pcVar13 = "Bad code word";
            }
          }
          else {
LAB_0010c5b2:
            if (data_size < uVar8) {
              if (dec->status_ != VP8_STATUS_OK) {
                return 0;
              }
              dec->status_ = VP8_STATUS_NOT_ENOUGH_DATA;
              pcVar13 = "bad partition length";
            }
            else {
              br_00 = &dec->br_;
              VP8InitBitReader(br_00,data,(ulong)uVar8);
              uVar20 = (ulong)(dec->frm_hdr_).partition_length_;
              if ((dec->frm_hdr_).key_frame_ != '\0') {
                uVar10 = VP8GetValue(br_00,1);
                (dec->pic_hdr_).colorspace_ = (uint8_t)uVar10;
                uVar10 = VP8GetValue(br_00,1);
                (dec->pic_hdr_).clamp_type_ = (uint8_t)uVar10;
              }
              uVar10 = VP8GetValue(br_00,1);
              (dec->segment_hdr_).use_segment_ = uVar10;
              if (uVar10 == 0) {
                (dec->segment_hdr_).update_map_ = 0;
              }
              else {
                uVar10 = VP8GetValue(br_00,1);
                (dec->segment_hdr_).update_map_ = uVar10;
                uVar10 = VP8GetValue(br_00,1);
                if (uVar10 != 0) {
                  uVar10 = VP8GetValue(br_00,1);
                  (dec->segment_hdr_).absolute_delta_ = uVar10;
                  for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
                    uVar10 = VP8GetValue(br_00,1);
                    if (uVar10 == 0) {
                      iVar6 = '\0';
                    }
                    else {
                      iVar11 = VP8GetSignedValue(br_00,7);
                      iVar6 = (int8_t)iVar11;
                    }
                    (dec->segment_hdr_).quantizer_[lVar21] = iVar6;
                  }
                  for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
                    uVar10 = VP8GetValue(br_00,1);
                    if (uVar10 == 0) {
                      iVar6 = '\0';
                    }
                    else {
                      iVar11 = VP8GetSignedValue(br_00,6);
                      iVar6 = (int8_t)iVar11;
                    }
                    (dec->segment_hdr_).filter_strength_[lVar21] = iVar6;
                  }
                }
                if ((dec->segment_hdr_).update_map_ != 0) {
                  for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
                    uVar10 = VP8GetValue(br_00,1);
                    if (uVar10 == 0) {
                      uVar7 = 0xff;
                    }
                    else {
                      uVar10 = VP8GetValue(br_00,8);
                      uVar7 = (uint8_t)uVar10;
                    }
                    (dec->proba_).segments_[lVar21] = uVar7;
                  }
                }
              }
              if ((dec->br_).eof_ == 0) {
                iVar9 = 1;
                uVar10 = VP8GetValue(br_00,1);
                (dec->filter_hdr_).simple_ = uVar10;
                uVar10 = VP8GetValue(br_00,6);
                (dec->filter_hdr_).level_ = uVar10;
                uVar10 = VP8GetValue(br_00,3);
                (dec->filter_hdr_).sharpness_ = uVar10;
                uVar10 = VP8GetValue(br_00,1);
                (dec->filter_hdr_).use_lf_delta_ = uVar10;
                if ((uVar10 != 0) && (uVar10 = VP8GetValue(br_00,1), uVar10 != 0)) {
                  for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
                    uVar10 = VP8GetValue(br_00,1);
                    if (uVar10 != 0) {
                      iVar11 = VP8GetSignedValue(br_00,6);
                      (dec->filter_hdr_).ref_lf_delta_[lVar21] = iVar11;
                    }
                  }
                  for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
                    uVar10 = VP8GetValue(br_00,1);
                    if (uVar10 != 0) {
                      iVar11 = VP8GetSignedValue(br_00,6);
                      (dec->filter_hdr_).mode_lf_delta_[lVar21] = iVar11;
                    }
                  }
                }
                if ((dec->filter_hdr_).level_ == 0) {
                  iVar12 = 0;
                }
                else {
                  iVar12 = ((dec->filter_hdr_).simple_ == 0) + 1;
                }
                dec->filter_type_ = iVar12;
                if ((dec->br_).eof_ == 0) {
                  uVar10 = VP8GetValue(br_00,2);
                  uVar8 = ~(-1 << ((byte)uVar10 & 0x1f));
                  uVar17 = (ulong)uVar8;
                  dec->num_parts_minus_one_ = uVar8;
                  uVar3 = uVar17 * 3;
                  size = (data_size - uVar20) + uVar17 * -3;
                  if (data_size - uVar20 < uVar3) {
                    VVar4 = VP8_STATUS_NOT_ENOUGH_DATA;
                  }
                  else {
                    start = data + uVar3 + uVar20;
                    br_01 = dec->parts_;
                    for (uVar18 = 0; uVar3 != uVar18; uVar18 = uVar18 + 3) {
                      size_00 = (ulong)CONCAT12(data[uVar18 + uVar20 + 2],
                                                *(undefined2 *)(data + uVar18 + uVar20));
                      if (size <= CONCAT12(data[uVar18 + uVar20 + 2],
                                           *(undefined2 *)(data + uVar18 + uVar20))) {
                        size_00 = size;
                      }
                      VP8InitBitReader(br_01,start,size_00);
                      start = start + size_00;
                      size = size - size_00;
                      br_01 = br_01 + 1;
                    }
                    VP8InitBitReader(dec->parts_ + uVar17,start,size);
                    if (start < data + data_size) {
                      VP8ParseQuant(dec);
                      if ((dec->frm_hdr_).key_frame_ != '\0') {
                        VP8GetValue(br_00,1);
                        VP8ParseProba(br_00,dec);
                        goto LAB_0010c497;
                      }
                      if (dec->status_ != VP8_STATUS_OK) {
                        return 0;
                      }
                      dec->status_ = VP8_STATUS_UNSUPPORTED_FEATURE;
                      pcVar13 = "Not a key frame.";
                      goto LAB_0010c491;
                    }
                    VVar4 = VP8_STATUS_SUSPENDED;
                  }
                  if (dec->status_ != VP8_STATUS_OK) {
                    return 0;
                  }
                  dec->status_ = VVar4;
                  pcVar13 = "cannot parse partitions";
                }
                else {
                  if (dec->status_ != VP8_STATUS_OK) {
                    return 0;
                  }
                  dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
                  pcVar13 = "cannot parse filter header";
                }
              }
              else {
                if (dec->status_ != VP8_STATUS_OK) {
                  return 0;
                }
                dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
                pcVar13 = "cannot parse segment header";
              }
            }
          }
        }
      }
      else {
        dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
        pcVar13 = "Incorrect keyframe parameters.";
      }
    }
  }
LAB_0010c491:
  dec->error_msg_ = pcVar13;
  iVar9 = 0;
LAB_0010c497:
  dec->ready_ = iVar9;
  return iVar9;
}

Assistant:

int VP8GetHeaders(VP8Decoder* const dec, VP8Io* const io) {
  const uint8_t* buf;
  size_t buf_size;
  VP8FrameHeader* frm_hdr;
  VP8PictureHeader* pic_hdr;
  VP8BitReader* br;
  VP8StatusCode status;

  if (dec == NULL) {
    return 0;
  }
  SetOk(dec);
  if (io == NULL) {
    return VP8SetError(dec, VP8_STATUS_INVALID_PARAM,
                       "null VP8Io passed to VP8GetHeaders()");
  }
  buf = io->data;
  buf_size = io->data_size;
  if (buf_size < 4) {
    return VP8SetError(dec, VP8_STATUS_NOT_ENOUGH_DATA,
                       "Truncated header.");
  }

  // Paragraph 9.1
  {
    const uint32_t bits = buf[0] | (buf[1] << 8) | (buf[2] << 16);
    frm_hdr = &dec->frm_hdr_;
    frm_hdr->key_frame_ = !(bits & 1);
    frm_hdr->profile_ = (bits >> 1) & 7;
    frm_hdr->show_ = (bits >> 4) & 1;
    frm_hdr->partition_length_ = (bits >> 5);
    if (frm_hdr->profile_ > 3) {
      return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                         "Incorrect keyframe parameters.");
    }
    if (!frm_hdr->show_) {
      return VP8SetError(dec, VP8_STATUS_UNSUPPORTED_FEATURE,
                         "Frame not displayable.");
    }
    buf += 3;
    buf_size -= 3;
  }

  pic_hdr = &dec->pic_hdr_;
  if (frm_hdr->key_frame_) {
    // Paragraph 9.2
    if (buf_size < 7) {
      return VP8SetError(dec, VP8_STATUS_NOT_ENOUGH_DATA,
                         "cannot parse picture header");
    }
    if (!VP8CheckSignature(buf, buf_size)) {
      return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                         "Bad code word");
    }
    pic_hdr->width_ = ((buf[4] << 8) | buf[3]) & 0x3fff;
    pic_hdr->xscale_ = buf[4] >> 6;   // ratio: 1, 5/4 5/3 or 2
    pic_hdr->height_ = ((buf[6] << 8) | buf[5]) & 0x3fff;
    pic_hdr->yscale_ = buf[6] >> 6;
    buf += 7;
    buf_size -= 7;

    dec->mb_w_ = (pic_hdr->width_ + 15) >> 4;
    dec->mb_h_ = (pic_hdr->height_ + 15) >> 4;

    // Setup default output area (can be later modified during io->setup())
    io->width = pic_hdr->width_;
    io->height = pic_hdr->height_;
    // IMPORTANT! use some sane dimensions in crop_* and scaled_* fields.
    // So they can be used interchangeably without always testing for
    // 'use_cropping'.
    io->use_cropping = 0;
    io->crop_top  = 0;
    io->crop_left = 0;
    io->crop_right  = io->width;
    io->crop_bottom = io->height;
    io->use_scaling  = 0;
    io->scaled_width = io->width;
    io->scaled_height = io->height;

    io->mb_w = io->width;   // for soundness
    io->mb_h = io->height;  // ditto

    VP8ResetProba(&dec->proba_);
    ResetSegmentHeader(&dec->segment_hdr_);
  }

  // Check if we have all the partition #0 available, and initialize dec->br_
  // to read this partition (and this partition only).
  if (frm_hdr->partition_length_ > buf_size) {
    return VP8SetError(dec, VP8_STATUS_NOT_ENOUGH_DATA,
                       "bad partition length");
  }

  br = &dec->br_;
  VP8InitBitReader(br, buf, frm_hdr->partition_length_);
  buf += frm_hdr->partition_length_;
  buf_size -= frm_hdr->partition_length_;

  if (frm_hdr->key_frame_) {
    pic_hdr->colorspace_ = VP8Get(br, "global-header");
    pic_hdr->clamp_type_ = VP8Get(br, "global-header");
  }
  if (!ParseSegmentHeader(br, &dec->segment_hdr_, &dec->proba_)) {
    return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                       "cannot parse segment header");
  }
  // Filter specs
  if (!ParseFilterHeader(br, dec)) {
    return VP8SetError(dec, VP8_STATUS_BITSTREAM_ERROR,
                       "cannot parse filter header");
  }
  status = ParsePartitions(dec, buf, buf_size);
  if (status != VP8_STATUS_OK) {
    return VP8SetError(dec, status, "cannot parse partitions");
  }

  // quantizer change
  VP8ParseQuant(dec);

  // Frame buffer marking
  if (!frm_hdr->key_frame_) {
    return VP8SetError(dec, VP8_STATUS_UNSUPPORTED_FEATURE,
                       "Not a key frame.");
  }

  VP8Get(br, "global-header");   // ignore the value of update_proba_

  VP8ParseProba(br, dec);

  // sanitized state
  dec->ready_ = 1;
  return 1;
}